

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFScanningDecoder.cpp
# Opt level: O2

DecoderResult *
ZXing::Pdf417::ScanningDecoder::Decode
          (DecoderResult *__return_storage_ptr__,BitMatrix *image,
          Nullable<ZXing::ResultPoint> *imageTopLeft,Nullable<ZXing::ResultPoint> *imageBottomLeft,
          Nullable<ZXing::ResultPoint> *imageTopRight,Nullable<ZXing::ResultPoint> *imageBottomRight
          ,int minCodewordWidth,int maxCodewordWidth)

{
  Codeword *pCVar1;
  pointer pNVar2;
  pointer pNVar3;
  pointer pvVar4;
  undefined4 uVar5;
  undefined5 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  vector<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
  *pvVar12;
  uint uVar13;
  long lVar14;
  RowIndicator rowIndicator;
  pointer pvVar15;
  pointer *ppiVar16;
  uint barcodeColumn;
  vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_> *row;
  pointer this;
  pointer pNVar17;
  int row_1;
  uint uVar18;
  DetectionResultColumn *pDVar19;
  BoundingBox *pBVar20;
  BoundingBox *pBVar21;
  pointer pNVar22;
  int column;
  uint uVar23;
  long lVar24;
  uint barcodeColumn_00;
  Nullable<ZXing::Pdf417::Codeword> *codeword_1;
  uint uVar25;
  uint uVar26;
  long lVar27;
  int iVar28;
  byte bVar29;
  ResultPoint RVar30;
  int local_590;
  int local_58c;
  BarcodeMetadata barcodeMetadata;
  vector<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
  barcodeMatrix;
  vector<int,_std::allocator<int>_> ambiguousIndexesList;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ambiguousIndexValues;
  vector<int,_std::allocator<int>_> erasures;
  vector<int,_std::allocator<int>_> codewords;
  BarcodeMetadata leftBarcodeMetadata;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  char *local_478;
  short local_470;
  Type local_46e;
  undefined1 local_420 [66];
  Type local_3de;
  DetectionResult detectionResult;
  Nullable<ZXing::Pdf417::BoundingBox> rightBox;
  undefined1 local_280 [24];
  BoundingBox boundingBox;
  Nullable<ZXing::Pdf417::DetectionResultColumn> rightRowIndicatorColumn;
  Nullable<ZXing::Pdf417::BoundingBox> local_150;
  Nullable<ZXing::Pdf417::DetectionResultColumn> leftRowIndicatorColumn;
  
  bVar29 = 0;
  BoundingBox::BoundingBox(&boundingBox);
  bVar7 = BoundingBox::Create(image->_width,image->_height,imageTopLeft,imageBottomLeft,
                              imageTopRight,imageBottomRight,&boundingBox);
  if (!bVar7) {
    memset(__return_storage_ptr__,0,0xd0);
    DecoderResult::DecoderResult(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  Nullable<ZXing::Pdf417::DetectionResultColumn>::Nullable(&leftRowIndicatorColumn);
  Nullable<ZXing::Pdf417::DetectionResultColumn>::Nullable(&rightRowIndicatorColumn);
  DetectionResult::DetectionResult(&detectionResult);
  local_58c = maxCodewordWidth;
  local_590 = minCodewordWidth;
  bVar7 = true;
  do {
    if (imageTopLeft->m_hasValue != false) {
      RVar30 = Nullable::operator_cast_to_ResultPoint((Nullable *)imageTopLeft);
      rightBox.m_value._0_8_ = RVar30.super_PointF.y;
      rightBox._0_8_ = RVar30.super_PointF.x;
      GetRowIndicatorColumn
                ((DetectionResultColumn *)&leftBarcodeMetadata,image,&boundingBox,
                 (ResultPoint *)&rightBox,true,minCodewordWidth,maxCodewordWidth);
      Nullable<ZXing::Pdf417::DetectionResultColumn>::operator=
                (&leftRowIndicatorColumn,(DetectionResultColumn *)&leftBarcodeMetadata);
      std::
      _Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ::~_Vector_base((_Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                       *)local_420);
    }
    if (imageTopRight->m_hasValue == true) {
      RVar30 = Nullable::operator_cast_to_ResultPoint((Nullable *)imageTopRight);
      rightBox.m_value._0_8_ = RVar30.super_PointF.y;
      rightBox._0_8_ = RVar30.super_PointF.x;
      GetRowIndicatorColumn
                ((DetectionResultColumn *)&leftBarcodeMetadata,image,&boundingBox,
                 (ResultPoint *)&rightBox,false,minCodewordWidth,maxCodewordWidth);
      Nullable<ZXing::Pdf417::DetectionResultColumn>::operator=
                (&rightRowIndicatorColumn,(DetectionResultColumn *)&leftBarcodeMetadata);
      std::
      _Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ::~_Vector_base((_Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                       *)local_420);
    }
    if (leftRowIndicatorColumn.m_hasValue == false) {
      if (rightRowIndicatorColumn.m_hasValue == true) {
        barcodeMetadata._columnCount = 0;
        barcodeMetadata._errorCorrectionLevel = 0;
        barcodeMetadata._rowCountUpperPart = 0;
        barcodeMetadata._rowCountLowerPart = 0;
        leftBarcodeMetadata._columnCount = 0;
        leftBarcodeMetadata._errorCorrectionLevel = 0;
        leftBarcodeMetadata._rowCountUpperPart = 0;
        leftBarcodeMetadata._rowCountLowerPart = 0;
        goto LAB_00185d27;
      }
LAB_00185e47:
      memset(__return_storage_ptr__,0,0xd0);
      DecoderResult::DecoderResult(__return_storage_ptr__);
      goto LAB_001867a5;
    }
    barcodeMetadata._columnCount = 0;
    barcodeMetadata._errorCorrectionLevel = 0;
    barcodeMetadata._rowCountUpperPart = 0;
    barcodeMetadata._rowCountLowerPart = 0;
    leftBarcodeMetadata._columnCount = 0;
    leftBarcodeMetadata._errorCorrectionLevel = 0;
    leftBarcodeMetadata._rowCountUpperPart = 0;
    leftBarcodeMetadata._rowCountLowerPart = 0;
    bVar8 = DetectionResultColumn::getBarcodeMetadata
                      (&leftRowIndicatorColumn.m_value,&leftBarcodeMetadata);
    if (bVar8) {
      rightBox.m_hasValue = false;
      rightBox._1_7_ = 0;
      rightBox.m_value._imgWidth = 0;
      rightBox.m_value._imgHeight = 0;
      if (((rightRowIndicatorColumn.m_hasValue & 1U) != 0) &&
         (bVar8 = DetectionResultColumn::getBarcodeMetadata
                            (&rightRowIndicatorColumn.m_value,(BarcodeMetadata *)&rightBox), bVar8))
      {
        if (leftBarcodeMetadata._columnCount != rightBox._0_4_) {
          if (leftBarcodeMetadata._errorCorrectionLevel != rightBox._4_4_) {
            if (leftBarcodeMetadata._rowCountLowerPart + leftBarcodeMetadata._rowCountUpperPart !=
                rightBox.m_value._imgHeight + rightBox.m_value._imgWidth) goto LAB_00185e47;
          }
        }
      }
      barcodeMetadata._columnCount = leftBarcodeMetadata._columnCount;
      barcodeMetadata._errorCorrectionLevel = leftBarcodeMetadata._errorCorrectionLevel;
      barcodeMetadata._rowCountUpperPart = leftBarcodeMetadata._rowCountUpperPart;
      barcodeMetadata._rowCountLowerPart = leftBarcodeMetadata._rowCountLowerPart;
    }
    else {
LAB_00185d27:
      if (((rightRowIndicatorColumn.m_hasValue & 1U) == 0) ||
         (bVar8 = DetectionResultColumn::getBarcodeMetadata
                            (&rightRowIndicatorColumn.m_value,&barcodeMetadata), !bVar8))
      goto LAB_00185e47;
    }
    Nullable<ZXing::Pdf417::BoundingBox>::Nullable
              ((Nullable<ZXing::Pdf417::BoundingBox> *)&leftBarcodeMetadata);
    Nullable<ZXing::Pdf417::BoundingBox>::Nullable(&rightBox);
    Nullable<ZXing::Pdf417::BoundingBox>::Nullable(&local_150);
    bVar8 = AdjustBoundingBox(&leftRowIndicatorColumn,
                              (Nullable<ZXing::Pdf417::BoundingBox> *)&leftBarcodeMetadata);
    if (((!bVar8) || (bVar8 = AdjustBoundingBox(&rightRowIndicatorColumn,&rightBox), !bVar8)) ||
       (bVar8 = BoundingBox::Merge((Nullable<ZXing::Pdf417::BoundingBox> *)&leftBarcodeMetadata,
                                   &rightBox,&local_150), !bVar8)) goto LAB_00185e47;
    DetectionResult::init(&detectionResult,(EVP_PKEY_CTX *)&barcodeMetadata);
    iVar11 = detectionResult._barcodeMetadata._columnCount;
    if (((!bVar7) || (detectionResult._boundingBox.m_hasValue != true)) ||
       ((boundingBox._minY <= detectionResult._boundingBox.m_value._minY &&
        (detectionResult._boundingBox.m_value._maxY <= boundingBox._maxY)))) break;
    Nullable::operator_cast_to_BoundingBox
              ((BoundingBox *)&leftBarcodeMetadata,(Nullable *)&detectionResult._boundingBox);
    pDVar19 = (DetectionResultColumn *)&leftBarcodeMetadata;
    pBVar20 = &boundingBox;
    for (lVar14 = 0xf; lVar14 != 0; lVar14 = lVar14 + -1) {
      iVar11 = (pDVar19->_boundingBox)._imgHeight;
      pBVar20->_imgWidth = (pDVar19->_boundingBox)._imgWidth;
      pBVar20->_imgHeight = iVar11;
      pDVar19 = (DetectionResultColumn *)((long)pDVar19 + (ulong)bVar29 * -0x10 + 8);
      pBVar20 = (BoundingBox *)((long)pBVar20 + (ulong)bVar29 * -0x10 + 8);
    }
    bVar7 = false;
  } while( true );
  detectionResult._boundingBox.m_hasValue = true;
  pBVar20 = &boundingBox;
  pBVar21 = &detectionResult._boundingBox.m_value;
  for (lVar14 = 0xf; lVar14 != 0; lVar14 = lVar14 + -1) {
    iVar28 = pBVar20->_imgHeight;
    pBVar21->_imgWidth = pBVar20->_imgWidth;
    pBVar21->_imgHeight = iVar28;
    pBVar20 = (BoundingBox *)((long)pBVar20 + (ulong)bVar29 * -0x10 + 8);
    pBVar21 = (BoundingBox *)((long)pBVar21 + (ulong)bVar29 * -0x10 + 8);
  }
  Nullable<ZXing::Pdf417::DetectionResultColumn>::operator=
            (detectionResult._detectionResultColumns.
             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&leftRowIndicatorColumn);
  barcodeColumn = iVar11 + 1;
  DetectionResult::setColumn(&detectionResult,barcodeColumn,&rightRowIndicatorColumn);
  uVar13 = leftRowIndicatorColumn.m_hasValue - 1 | 1;
  uVar25 = 0;
  if (0 < (int)barcodeColumn) {
    uVar25 = barcodeColumn;
  }
  for (uVar23 = 1; uVar23 != uVar25 + 1; uVar23 = uVar23 + 1) {
    barcodeColumn_00 = barcodeColumn - uVar23;
    if (leftRowIndicatorColumn.m_hasValue != false) {
      barcodeColumn_00 = uVar23;
    }
    if (detectionResult._detectionResultColumns.
        super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(int)barcodeColumn_00].m_hasValue == false) {
      rowIndicator = (uint)(barcodeColumn_00 == barcodeColumn) * 2;
      if (barcodeColumn_00 == 0) {
        rowIndicator = Left;
      }
      DetectionResultColumn::DetectionResultColumn
                ((DetectionResultColumn *)&rightBox,&boundingBox,rowIndicator);
      Nullable<ZXing::Pdf417::DetectionResultColumn>::Nullable
                ((Nullable<ZXing::Pdf417::DetectionResultColumn> *)&leftBarcodeMetadata,
                 (DetectionResultColumn *)&rightBox);
      DetectionResult::setColumn
                (&detectionResult,barcodeColumn_00,
                 (Nullable<ZXing::Pdf417::DetectionResultColumn> *)&leftBarcodeMetadata);
      std::
      _Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ::~_Vector_base((_Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                       *)(local_420 + 8));
      std::
      _Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ::~_Vector_base((_Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                       *)&rightBox.m_value._minY);
      uVar26 = barcodeColumn_00 - uVar13;
      iVar11 = -1;
      for (iVar28 = boundingBox._minY; iVar28 <= boundingBox._maxY; iVar28 = iVar28 + 1) {
        if (((int)uVar26 < 0) || (detectionResult._barcodeMetadata._columnCount + 1 < (int)uVar26))
        {
LAB_00186029:
          DetectionResultColumn::codewordNearby
                    ((Nullable<ZXing::Pdf417::Codeword> *)&leftBarcodeMetadata,
                     &detectionResult._detectionResultColumns.
                      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(int)barcodeColumn_00].m_value,
                     iVar28);
          if ((leftBarcodeMetadata._0_8_ & 1) == 0) {
            if ((-1 < (int)uVar26) &&
               ((int)uVar26 <= detectionResult._barcodeMetadata._columnCount + 1)) {
              DetectionResultColumn::codewordNearby
                        ((Nullable<ZXing::Pdf417::Codeword> *)&leftBarcodeMetadata,
                         &detectionResult._detectionResultColumns.
                          super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar26].m_value,iVar28);
            }
            if (((byte)leftBarcodeMetadata._columnCount & 1) == 0) {
              iVar9 = 0;
              uVar18 = barcodeColumn_00;
              while ((uVar18 = uVar18 - uVar13, -1 < (int)uVar18 &&
                     ((int)uVar18 <= detectionResult._barcodeMetadata._columnCount + 1))) {
                for (pNVar22 = detectionResult._detectionResultColumns.
                               super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar18].m_value._codewords.
                               super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    pNVar22 !=
                    detectionResult._detectionResultColumns.
                    super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar18].m_value._codewords.
                    super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pNVar22 = pNVar22 + 1) {
                  if (pNVar22->m_hasValue == true) {
                    iVar9 = ((pNVar22->m_value)._endX - (pNVar22->m_value)._startX) * iVar9 * uVar13
                            + (&(pNVar22->m_value)._startX)[leftRowIndicatorColumn.m_hasValue];
                    goto LAB_00186146;
                  }
                }
                iVar9 = iVar9 + 1;
              }
              iVar9 = detectionResult._boundingBox.m_value._maxX;
              if (leftRowIndicatorColumn.m_hasValue != false) {
                iVar9 = detectionResult._boundingBox.m_value._minX;
              }
            }
            else {
              iVar9 = leftBarcodeMetadata._rowCountUpperPart;
              if (leftRowIndicatorColumn.m_hasValue == false) {
                iVar9 = leftBarcodeMetadata._errorCorrectionLevel;
              }
            }
          }
          else {
            iVar9 = leftBarcodeMetadata._rowCountUpperPart;
            if (leftRowIndicatorColumn.m_hasValue != false) {
              iVar9 = leftBarcodeMetadata._errorCorrectionLevel;
            }
          }
        }
        else {
          lVar14 = (long)iVar28 -
                   (long)detectionResult._detectionResultColumns.
                         super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar26].m_value._boundingBox.
                         _minY;
          pNVar22 = detectionResult._detectionResultColumns.
                    super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar26].m_value._codewords.
                    super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pNVar22[lVar14].m_hasValue & 1U) == 0) goto LAB_00186029;
          iVar9 = *(int *)((long)&pNVar22[lVar14].m_value._startX +
                          (ulong)leftRowIndicatorColumn.m_hasValue * 4);
        }
LAB_00186146:
        if ((boundingBox._maxX < iVar9 || iVar9 < 0) && (iVar9 = iVar11, iVar11 == -1)) {
          iVar11 = -1;
        }
        else {
          DetectCodeword((Nullable<ZXing::Pdf417::Codeword> *)&leftBarcodeMetadata,image,
                         boundingBox._minX,boundingBox._maxX,leftRowIndicatorColumn.m_hasValue,iVar9
                         ,iVar28,local_590,local_58c);
          pNVar17 = detectionResult._detectionResultColumns.
                    super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((byte)leftBarcodeMetadata._columnCount == '\x01') {
            Nullable::operator_cast_to_Codeword
                      ((Codeword *)local_280,(Nullable *)&leftBarcodeMetadata);
            rightBox.m_value._topLeft._0_4_ = local_280._16_4_;
            rightBox._0_8_ = local_280._0_8_;
            rightBox.m_value._imgWidth = local_280._8_4_;
            rightBox.m_value._imgHeight = local_280._12_4_;
            lVar14 = (long)iVar28 - (long)pNVar17[(int)barcodeColumn_00].m_value._boundingBox._minY;
            pNVar22 = pNVar17[(int)barcodeColumn_00].m_value._codewords.
                      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pNVar22[lVar14].m_hasValue = true;
            pNVar22[lVar14].m_value._rowNumber = local_280._16_4_;
            pCVar1 = &pNVar22[lVar14].m_value;
            pCVar1->_startX = local_280._0_4_;
            pCVar1->_endX = local_280._4_4_;
            pCVar1->_bucket = local_280._8_4_;
            pCVar1->_value = local_280._12_4_;
            iVar10 = leftBarcodeMetadata._rowCountUpperPart -
                     leftBarcodeMetadata._errorCorrectionLevel;
            if (iVar10 <= local_590) {
              local_590 = iVar10;
            }
            iVar11 = iVar9;
            if (local_58c <= iVar10) {
              local_58c = iVar10;
            }
          }
        }
      }
    }
  }
  std::
  vector<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
  ::vector(&barcodeMatrix,
           (long)detectionResult._barcodeMetadata._rowCountLowerPart +
           (long)detectionResult._barcodeMetadata._rowCountUpperPart,
           (allocator_type *)&leftBarcodeMetadata);
  pvVar4 = barcodeMatrix.
           super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this = barcodeMatrix.
              super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; this != pvVar4; this = this + 1) {
    std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>::resize
              (this,(long)detectionResult._barcodeMetadata._columnCount + 2);
  }
  pvVar12 = DetectionResult::allColumns(&detectionResult);
  pNVar2 = (pvVar12->
           super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar14 = 0;
  for (pNVar17 = (pvVar12->
                 super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pNVar17 != pNVar2;
      pNVar17 = pNVar17 + 1) {
    if (pNVar17->m_hasValue == true) {
      pNVar3 = (pNVar17->m_value)._codewords.
               super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pNVar22 = (pNVar17->m_value)._codewords.
                     super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pNVar22 != pNVar3;
          pNVar22 = pNVar22 + 1) {
        if (pNVar22->m_hasValue == true) {
          iVar11 = (pNVar22->m_value)._rowNumber;
          if ((-1 < (long)iVar11) &&
             (iVar11 < (int)(((long)barcodeMatrix.
                                    super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)barcodeMatrix.
                                   super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18))) {
            BarcodeValue::setValue
                      (barcodeMatrix.
                       super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar11].
                       super__Vector_base<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar14,(pNVar22->m_value)._value)
            ;
          }
        }
      }
    }
    lVar14 = lVar14 + 1;
  }
  BarcodeValue::value((vector<int,_std::allocator<int>_> *)&leftBarcodeMetadata,
                      ((barcodeMatrix.
                        super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1);
  iVar28 = (detectionResult._barcodeMetadata._rowCountLowerPart +
           detectionResult._barcodeMetadata._rowCountUpperPart) *
           detectionResult._barcodeMetadata._columnCount;
  iVar9 = -2 << ((byte)detectionResult._barcodeMetadata._errorCorrectionLevel & 0x1f);
  iVar11 = 0;
  if (0xfffffc5f < (iVar9 + iVar28) - 0x3a1U) {
    iVar11 = iVar9 + iVar28;
  }
  if (leftBarcodeMetadata._0_8_ == leftBarcodeMetadata._8_8_) {
    if (iVar11 == 0) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&leftBarcodeMetadata);
      memset(__return_storage_ptr__,0,0xd0);
      DecoderResult::DecoderResult(__return_storage_ptr__);
      goto LAB_0018679b;
    }
LAB_001863ff:
    BarcodeValue::setValue
              (((barcodeMatrix.
                 super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,iVar11);
  }
  else if ((iVar11 != 0) && (*(int *)leftBarcodeMetadata._0_8_ != iVar11)) goto LAB_001863ff;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&leftBarcodeMetadata);
  erasures.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  erasures.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  erasures.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  leftBarcodeMetadata._0_8_ = leftBarcodeMetadata._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::vector
            (&codewords,
             (long)detectionResult._barcodeMetadata._columnCount *
             ((long)detectionResult._barcodeMetadata._rowCountLowerPart +
             (long)detectionResult._barcodeMetadata._rowCountUpperPart),
             &leftBarcodeMetadata._columnCount,(allocator_type *)&rightBox);
  ambiguousIndexValues.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ambiguousIndexValues.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ambiguousIndexValues.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ambiguousIndexesList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  ambiguousIndexesList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  ambiguousIndexesList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  for (lVar14 = 0;
      lVar14 < (long)detectionResult._barcodeMetadata._rowCountLowerPart +
               (long)detectionResult._barcodeMetadata._rowCountUpperPart; lVar14 = lVar14 + 1) {
    lVar27 = 0x30;
    for (lVar24 = 0; lVar24 < detectionResult._barcodeMetadata._columnCount; lVar24 = lVar24 + 1) {
      BarcodeValue::value((vector<int,_std::allocator<int>_> *)&leftBarcodeMetadata,
                          (BarcodeValue *)
                          ((long)&((barcodeMatrix.
                                    super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar14].
                                    super__Vector_base<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_values)._M_t.
                                  _M_impl + lVar27));
      iVar11 = detectionResult._barcodeMetadata._columnCount * (int)lVar14 + (int)lVar24;
      rightBox._0_4_ = iVar11;
      if (leftBarcodeMetadata._0_8_ == leftBarcodeMetadata._8_8_) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&erasures,(value_type_conflict3 *)&rightBox);
      }
      else if (leftBarcodeMetadata._8_8_ - leftBarcodeMetadata._0_8_ == 4) {
        codewords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar11] = *(int *)leftBarcodeMetadata._0_8_;
      }
      else {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&ambiguousIndexesList,(value_type_conflict3 *)&rightBox);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back(&ambiguousIndexValues,(value_type *)&leftBarcodeMetadata);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&leftBarcodeMetadata);
      lVar27 = lVar27 + 0x30;
    }
  }
  leftBarcodeMetadata._0_8_ = leftBarcodeMetadata._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&barcodeMetadata,
             (long)ambiguousIndexesList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)ambiguousIndexesList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,&leftBarcodeMetadata._columnCount,
             (allocator_type *)&rightBox);
  iVar11 = 100;
  while (bVar7 = iVar11 != 0, iVar11 = iVar11 + -1, bVar7) {
    pvVar15 = ambiguousIndexValues.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (lVar14 = 0; (long)(barcodeMetadata._8_8_ - barcodeMetadata._0_8_) >> 2 != lVar14;
        lVar14 = lVar14 + 1) {
      codewords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[ambiguousIndexesList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar14]] =
           (pvVar15->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start[*(int *)(barcodeMetadata._0_8_ + lVar14 * 4)];
      pvVar15 = pvVar15 + 1;
    }
    DecodeCodewords((DecoderResult *)&leftBarcodeMetadata,&codewords,
                    1 << ((char)detectionResult._barcodeMetadata._errorCorrectionLevel + 1U & 0x1f),
                    &erasures);
    uVar6 = rightBox.m_value._topLeft._4_5_;
    uVar5 = rightBox.m_value._topLeft._0_4_;
    if (local_3de != Checksum) {
      DecoderResult::DecoderResult(__return_storage_ptr__,(DecoderResult *)&leftBarcodeMetadata);
LAB_00186750:
      DecoderResult::~DecoderResult((DecoderResult *)&leftBarcodeMetadata);
      goto LAB_0018675d;
    }
    rightBox.m_value._topLeft._1_3_ = local_150.m_value._topLeft._1_3_;
    rightBox.m_value._topLeft._4_5_ = local_150.m_value._topLeft._4_5_;
    if (barcodeMetadata._0_8_ == barcodeMetadata._8_8_) {
      local_150._0_8_ = (long)&local_150 + 0x10;
      rightBox._0_8_ = &rightBox.m_value._topLeft;
      rightBox.m_value._topLeft._0_4_ = (uint)(uint3)rightBox.m_value._topLeft._1_3_ << 8;
      rightBox.m_value._topLeft.m_value.super_PointF.x._1_4_ =
           local_150.m_value._topLeft.m_value.super_PointF.x._1_4_;
      rightBox.m_value._topLeft.m_value.super_PointF.x._5_2_ =
           local_150.m_value._topLeft.m_value.super_PointF.x._5_2_;
      rightBox.m_value._topLeft.m_value.super_PointF.x._7_1_ =
           local_150.m_value._topLeft.m_value.super_PointF.x._7_1_;
      rightBox.m_value._imgWidth = 0;
      rightBox.m_value._imgHeight = 0;
      local_150.m_value._imgWidth = 0;
      local_150.m_value._imgHeight = 0;
      local_150.m_value._topLeft.m_hasValue = false;
      rightBox.m_value._topLeft.m_value.super_PointF.y = (double)anon_var_dwarf_281500;
      rightBox.m_value._bottomLeft.m_hasValue = true;
      rightBox.m_value._bottomLeft._1_1_ = 2;
      rightBox.m_value._bottomLeft._2_1_ = 2;
      DecoderResult::DecoderResult(__return_storage_ptr__,(Error *)&rightBox);
LAB_00186736:
      std::__cxx11::string::~string((string *)&rightBox);
      std::__cxx11::string::~string((string *)&local_150);
      goto LAB_00186750;
    }
    lVar14 = (long)(barcodeMetadata._8_8_ - barcodeMetadata._0_8_) >> 2;
    ppiVar16 = &((ambiguousIndexValues.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish;
    lVar27 = 0;
    while (lVar14 != lVar27) {
      iVar28 = *(int *)(barcodeMetadata._0_8_ + lVar27 * 4);
      if (iVar28 < (int)((ulong)((long)*ppiVar16 -
                                (long)((_Vector_impl_data *)(ppiVar16 + -1))->_M_start) >> 2) + -1)
      {
        *(int *)(barcodeMetadata._0_8_ + lVar27 * 4) = iVar28 + 1;
        break;
      }
      *(undefined4 *)(barcodeMetadata._0_8_ + lVar27 * 4) = 0;
      lVar27 = lVar27 + 1;
      ppiVar16 = ppiVar16 + 3;
      if (lVar14 == lVar27) {
        local_150._0_8_ = (long)&local_150 + 0x10;
        rightBox._0_8_ = &rightBox.m_value._topLeft;
        rightBox.m_value._topLeft._0_4_ = (uint)(uint3)rightBox.m_value._topLeft._1_3_ << 8;
        rightBox.m_value._topLeft.m_value.super_PointF.x._1_4_ =
             local_150.m_value._topLeft.m_value.super_PointF.x._1_4_;
        rightBox.m_value._topLeft.m_value.super_PointF.x._5_2_ =
             local_150.m_value._topLeft.m_value.super_PointF.x._5_2_;
        rightBox.m_value._topLeft.m_value.super_PointF.x._7_1_ =
             local_150.m_value._topLeft.m_value.super_PointF.x._7_1_;
        rightBox.m_value._imgWidth = 0;
        rightBox.m_value._imgHeight = 0;
        local_150.m_value._imgWidth = 0;
        local_150.m_value._imgHeight = 0;
        local_150.m_value._topLeft.m_hasValue = false;
        rightBox.m_value._topLeft.m_value.super_PointF.y = (double)anon_var_dwarf_281500;
        rightBox.m_value._bottomLeft.m_hasValue = true;
        rightBox.m_value._bottomLeft._1_1_ = 2;
        rightBox.m_value._bottomLeft._2_1_ = 2;
        DecoderResult::DecoderResult(__return_storage_ptr__,(Error *)&rightBox);
        goto LAB_00186736;
      }
    }
    rightBox.m_value._topLeft._0_4_ = uVar5;
    rightBox.m_value._topLeft._4_5_ = uVar6;
    DecoderResult::~DecoderResult((DecoderResult *)&leftBarcodeMetadata);
  }
  rightBox._0_8_ = &rightBox.m_value._topLeft;
  leftBarcodeMetadata._0_8_ = &local_488;
  local_488._M_local_buf[0] = false;
  local_488._4_5_ = rightBox.m_value._topLeft._4_5_;
  local_488._1_3_ = rightBox.m_value._topLeft._1_3_;
  local_488._9_4_ = rightBox.m_value._topLeft.m_value.super_PointF.x._1_4_;
  local_488._13_2_ = rightBox.m_value._topLeft.m_value.super_PointF.x._5_2_;
  local_488._M_local_buf[0xf] = rightBox.m_value._topLeft.m_value.super_PointF.x._7_1_;
  leftBarcodeMetadata._rowCountUpperPart = 0;
  leftBarcodeMetadata._rowCountLowerPart = 0;
  rightBox.m_value._imgWidth = 0;
  rightBox.m_value._imgHeight = 0;
  rightBox.m_value._topLeft._0_4_ = rightBox.m_value._topLeft._0_4_ & 0xffffff00;
  local_478 = "src/pdf417/PDFScanningDecoder.cpp";
  local_470 = 0x280;
  local_46e = Checksum;
  DecoderResult::DecoderResult(__return_storage_ptr__,(Error *)&leftBarcodeMetadata);
  std::__cxx11::string::~string((string *)&leftBarcodeMetadata);
  std::__cxx11::string::~string((string *)&rightBox);
LAB_0018675d:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&barcodeMetadata);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&ambiguousIndexesList.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&ambiguousIndexValues);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&codewords.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&erasures.super__Vector_base<int,_std::allocator<int>_>);
LAB_0018679b:
  std::
  vector<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
  ::~vector(&barcodeMatrix);
LAB_001867a5:
  std::
  vector<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
  ::~vector(&detectionResult._detectionResultColumns);
  std::
  _Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ::~_Vector_base(&rightRowIndicatorColumn.m_value._codewords.
                   super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                 );
  std::
  _Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ::~_Vector_base(&leftRowIndicatorColumn.m_value._codewords.
                   super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

DecoderResult
ScanningDecoder::Decode(const BitMatrix& image, const Nullable<ResultPoint>& imageTopLeft, const Nullable<ResultPoint>& imageBottomLeft,
	const Nullable<ResultPoint>& imageTopRight, const Nullable<ResultPoint>& imageBottomRight,
	int minCodewordWidth, int maxCodewordWidth)
{
	BoundingBox boundingBox;
	if (!BoundingBox::Create(image.width(), image.height(), imageTopLeft, imageBottomLeft, imageTopRight, imageBottomRight, boundingBox)) {
		return {};
	}
	
	Nullable<DetectionResultColumn> leftRowIndicatorColumn, rightRowIndicatorColumn;
	DetectionResult detectionResult;
	for (int i = 0; i < 2; i++) {
		if (imageTopLeft != nullptr) {
			leftRowIndicatorColumn = GetRowIndicatorColumn(image, boundingBox, imageTopLeft, true, minCodewordWidth, maxCodewordWidth);
		}
		if (imageTopRight != nullptr) {
			rightRowIndicatorColumn = GetRowIndicatorColumn(image, boundingBox, imageTopRight, false, minCodewordWidth, maxCodewordWidth);
		}
		if (!Merge(leftRowIndicatorColumn, rightRowIndicatorColumn, detectionResult)) {
			return {};
		}
		if (i == 0 && detectionResult.getBoundingBox() != nullptr && (detectionResult.getBoundingBox().value().minY() < boundingBox.minY() || detectionResult.getBoundingBox().value().maxY() > boundingBox.maxY())) {
			boundingBox = detectionResult.getBoundingBox();
		}
		else {
			detectionResult.setBoundingBox(boundingBox);
			break;
		}
	}

	int maxBarcodeColumn = detectionResult.barcodeColumnCount() + 1;
	detectionResult.setColumn(0, leftRowIndicatorColumn);
	detectionResult.setColumn(maxBarcodeColumn, rightRowIndicatorColumn);

	bool leftToRight = leftRowIndicatorColumn != nullptr;
	for (int barcodeColumnCount = 1; barcodeColumnCount <= maxBarcodeColumn; barcodeColumnCount++) {
		int barcodeColumn = leftToRight ? barcodeColumnCount : maxBarcodeColumn - barcodeColumnCount;
		if (detectionResult.column(barcodeColumn) != nullptr) {
			// This will be the case for the opposite row indicator column, which doesn't need to be decoded again.
			continue;
		}
		DetectionResultColumn::RowIndicator rowIndicator = barcodeColumn == 0 ? DetectionResultColumn::RowIndicator::Left : (barcodeColumn == maxBarcodeColumn ? DetectionResultColumn::RowIndicator::Right : DetectionResultColumn::RowIndicator::None);
		detectionResult.setColumn(barcodeColumn, DetectionResultColumn(boundingBox, rowIndicator));
		int startColumn = -1;
		int previousStartColumn = startColumn;
		// TODO start at a row for which we know the start position, then detect upwards and downwards from there.
		for (int imageRow = boundingBox.minY(); imageRow <= boundingBox.maxY(); imageRow++) {
			startColumn = GetStartColumn(detectionResult, barcodeColumn, imageRow, leftToRight);
			if (startColumn < 0 || startColumn > boundingBox.maxX()) {
				if (previousStartColumn == -1) {
					continue;
				}
				startColumn = previousStartColumn;
			}
			Nullable<Codeword> codeword = DetectCodeword(image, boundingBox.minX(), boundingBox.maxX(), leftToRight, startColumn, imageRow, minCodewordWidth, maxCodewordWidth);
			if (codeword != nullptr) {
				detectionResult.column(barcodeColumn).value().setCodeword(imageRow, codeword);
				previousStartColumn = startColumn;
				UpdateMinMax(minCodewordWidth, maxCodewordWidth, codeword.value().width());
			}
		}
	}
	return CreateDecoderResult(detectionResult);
}